

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O3

ssize_t bgzf_read(BGZF *fp,void *data,size_t length)

{
  hFILE *phVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong __n;
  
  if (length == 0) {
    uVar5 = 0;
  }
  else {
    if ((fp->field_0x2 & 3) != 0) {
      __assert_fail("fp->is_write == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/bgzf.c"
                    ,0x228,"ssize_t bgzf_read(BGZF *, void *, size_t)");
    }
    iVar2 = fp->block_offset;
    uVar5 = 0;
    do {
      uVar4 = fp->block_length - iVar2;
      if (uVar4 == 0 || fp->block_length < iVar2) {
        iVar2 = bgzf_read_block(fp);
        if (iVar2 != 0) {
          return -1;
        }
        iVar3 = fp->block_length;
        iVar2 = fp->block_offset;
        uVar4 = iVar3 - iVar2;
        if (uVar4 == 0 || iVar3 < iVar2) goto LAB_0013c91e;
      }
      __n = length - uVar5;
      if ((ulong)uVar4 <= length - uVar5) {
        __n = (ulong)uVar4;
      }
      memcpy(data,(void *)((long)iVar2 + (long)fp->uncompressed_block),__n);
      iVar2 = fp->block_offset + (int)__n;
      fp->block_offset = iVar2;
      data = (void *)((long)data + __n);
      uVar5 = uVar5 + __n;
    } while (uVar5 < length);
    iVar3 = fp->block_length;
LAB_0013c91e:
    if (iVar2 == iVar3) {
      phVar1 = fp->fp;
      fp->block_address = (int64_t)(phVar1->begin + (phVar1->offset - (long)phVar1->buffer));
      fp->block_length = 0;
      fp->block_offset = 0;
    }
    fp->uncompressed_address = fp->uncompressed_address + uVar5;
  }
  return uVar5;
}

Assistant:

ssize_t bgzf_read(BGZF *fp, void *data, size_t length)
{
    ssize_t bytes_read = 0;
    uint8_t *output = (uint8_t*)data;
    if (length <= 0) return 0;
    assert(fp->is_write == 0);
    while (bytes_read < length) {
        int copy_length, available = fp->block_length - fp->block_offset;
        uint8_t *buffer;
        if (available <= 0) {
            if (bgzf_read_block(fp) != 0) return -1;
            available = fp->block_length - fp->block_offset;
            if (available <= 0) break;
        }
        copy_length = length - bytes_read < available? length - bytes_read : available;
        buffer = (uint8_t*)fp->uncompressed_block;
        memcpy(output, buffer + fp->block_offset, copy_length);
        fp->block_offset += copy_length;
        output += copy_length;
        bytes_read += copy_length;
    }
    if (fp->block_offset == fp->block_length) {
        fp->block_address = htell(fp->fp);
        fp->block_offset = fp->block_length = 0;
    }
    fp->uncompressed_address += bytes_read;
    return bytes_read;
}